

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

ModBroadcastableLayerParams * __thiscall
CoreML::Specification::ModBroadcastableLayerParams::New
          (ModBroadcastableLayerParams *this,Arena *arena)

{
  ModBroadcastableLayerParams *this_00;
  
  this_00 = (ModBroadcastableLayerParams *)operator_new(0x18);
  ModBroadcastableLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ModBroadcastableLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

ModBroadcastableLayerParams* ModBroadcastableLayerParams::New(::google::protobuf::Arena* arena) const {
  ModBroadcastableLayerParams* n = new ModBroadcastableLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}